

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O0

void __thiscall QtWidgetsActionPrivate::destroy(QtWidgetsActionPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  QtWidgetsActionPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *graphicsWidget;
  QWidget *widget;
  QObject *object;
  QAction *q;
  const_reverse_iterator it;
  const_reverse_iterator end;
  QObjectList objects;
  QObject *in_stack_ffffffffffffff98;
  QGraphicsWidget *in_stack_ffffffffffffffa8;
  QAction *action;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QList<QObject_*>::QList((QList<QObject_*> *)in_RDI,(QList<QObject_*> *)in_stack_ffffffffffffff98);
  action = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QObject_*>::crend((QList<QObject_*> *)in_stack_ffffffffffffffa8);
  QList<QObject_*>::crbegin((QList<QObject_*> *)in_stack_ffffffffffffffa8);
  while (bVar2 = std::operator!=((reverse_iterator<QList<QObject_*>::const_iterator> *)in_RDI,
                                 (reverse_iterator<QList<QObject_*>::const_iterator> *)
                                 in_stack_ffffffffffffff98), bVar2) {
    std::reverse_iterator<QList<QObject_*>::const_iterator>::operator*
              ((reverse_iterator<QList<QObject_*>::const_iterator> *)in_RDI);
    pQVar3 = qobject_cast<QWidget*>(in_stack_ffffffffffffff98);
    if (pQVar3 == (QWidget *)0x0) {
      in_stack_ffffffffffffffa8 = qobject_cast<QGraphicsWidget*>((QObject *)0x4b0358);
      if (in_stack_ffffffffffffffa8 != (QGraphicsWidget *)0x0) {
        QGraphicsWidget::removeAction((QWindow *)in_stack_ffffffffffffffa8,action);
      }
    }
    else {
      QWidget::removeAction((QWidget *)in_stack_ffffffffffffffa8,action);
    }
    std::reverse_iterator<QList<QObject_*>::const_iterator>::operator++
              ((reverse_iterator<QList<QObject_*>::const_iterator> *)in_RDI);
  }
  QList<QObject_*>::~QList((QList<QObject_*> *)0x4b0391);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtWidgetsActionPrivate::destroy()
{
    Q_Q(QAction);
    const auto objects = associatedObjects;
    const auto end = objects.crend();
    for (auto it = objects.crbegin(); it != end; ++it) {
        QObject *object = *it;
        if (QWidget *widget = qobject_cast<QWidget*>(object))
            widget->removeAction(q);
#if QT_CONFIG(graphicsview)
        else if (QGraphicsWidget *graphicsWidget = qobject_cast<QGraphicsWidget*>(object))
            graphicsWidget->removeAction(q);
#endif
    }
}